

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

TargetType __thiscall
cmExportInstallFileGenerator::GetExportTargetType
          (cmExportInstallFileGenerator *this,cmTargetExport *targetExport)

{
  TargetType TVar1;
  
  TVar1 = cmGeneratorTarget::GetType(targetExport->Target);
  if (TVar1 == OBJECT_LIBRARY) {
    TVar1 = (uint)(targetExport->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
            OBJECT_LIBRARY;
  }
  return TVar1;
}

Assistant:

cmStateEnums::TargetType cmExportInstallFileGenerator::GetExportTargetType(
  cmTargetExport const* targetExport) const
{
  cmStateEnums::TargetType targetType = targetExport->Target->GetType();
  // An OBJECT library installed with no OBJECTS DESTINATION
  // is transformed to an INTERFACE library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      targetExport->ObjectsGenerator == nullptr) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}